

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::drawTranslateHandles(XFormWidget *this)

{
  bool bVar1;
  bool bVar2;
  pointer pVVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Vector3D b_1;
  Vector3D c;
  Vector3D b;
  Vector3D p1;
  Vector3D p0;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  XFormWidget *local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    bVar1 = this->objectMode;
    bVar2 = this->transformedMode;
    local_e8 = (this->center).x;
    local_e0 = (this->center).y;
    local_d8 = (this->center).z;
    dVar11 = (this->bounds).max.x - (this->bounds).min.x;
    dVar12 = (this->bounds).max.y - (this->bounds).min.y;
    dVar10 = (this->bounds).max.z - (this->bounds).min.z;
    dVar10 = dVar10 * dVar10 + dVar11 * dVar11 + dVar12 * dVar12;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    dVar10 = dVar10 * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    dVar11 = dVar10 * 0.85;
    uVar7 = 0;
    if (bVar2 != false) {
      uVar7 = (ulong)(((byte)~bVar1 & 1) * 2);
    }
    lVar6 = (ulong)(uint)((int)uVar7 * 8) * 3;
    do {
      pVVar3 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_90 = *(double *)((long)&pVVar3->x + lVar6) * dVar11 + local_e8;
      local_88 = *(double *)((long)&pVVar3->y + lVar6) * dVar11 + local_e0;
      local_80 = *(double *)((long)&pVVar3->z + lVar6) * dVar11 + local_d8;
      glColor4ubv(*(undefined8 *)
                   ((long)&(((this->axisColors).
                             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data + lVar6));
      glVertex3dv(&local_e8);
      glVertex3dv(&local_90);
      lVar6 = lVar6 + 0x18;
    } while (lVar6 != 0x48);
    local_d0 = this;
    glEnd();
    glBegin(4);
    local_78 = dVar10 * 0.5 * 0.15;
    do {
      pVVar3 = (local_d0->axes).
               super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_90 = pVVar3[uVar7].x * dVar10 + local_e8;
      local_88 = pVVar3[uVar7].y * dVar10 + local_e0;
      local_80 = pVVar3[uVar7].z * dVar10 + local_d8;
      local_100 = pVVar3[uVar7].x * dVar11 + local_e8;
      local_f8 = pVVar3[uVar7].y * dVar11 + local_e0;
      local_f0 = pVVar3[uVar7].z * dVar11 + local_d8;
      uVar8 = uVar7 + 1;
      uVar9 = uVar8 & 0xffffffff;
      if (uVar8 == 3) {
        uVar9 = 0;
      }
      local_a0 = pVVar3[uVar9].x * local_78;
      local_a8 = pVVar3[uVar9].y * local_78;
      local_b0 = pVVar3[uVar9].z * local_78;
      uVar4 = ((int)uVar7 + 2U) % 3;
      local_b8 = pVVar3[uVar4].x * local_78;
      local_c0 = pVVar3[uVar4].y * local_78;
      local_c8 = pVVar3[uVar4].z * local_78;
      glColor4ubv((local_d0->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      local_68 = 0.0;
      iVar5 = 1;
      do {
        dVar15 = local_68 * 6.283185307179586 * 0.125;
        local_68 = local_68 + 1.0;
        local_98 = (double)iVar5 * 6.283185307179586 * 0.125;
        dVar12 = cos(dVar15);
        local_70 = local_a0 * dVar12 + local_100;
        dVar13 = local_a8 * dVar12 + local_f8;
        dVar12 = dVar12 * local_b0 + local_f0;
        dVar15 = sin(dVar15);
        local_48 = local_70 - local_b8 * dVar15;
        local_40 = dVar13 - local_c0 * dVar15;
        local_38 = dVar12 - dVar15 * local_c8;
        dVar12 = cos(local_98);
        dVar13 = local_a0 * dVar12 + local_100;
        dVar14 = local_a8 * dVar12 + local_f8;
        dVar12 = dVar12 * local_b0 + local_f0;
        dVar15 = sin(local_98);
        local_60 = dVar13 - local_b8 * dVar15;
        local_58 = dVar14 - local_c0 * dVar15;
        local_50 = dVar12 - dVar15 * local_c8;
        glVertex3dv(&local_90);
        glVertex3dv(&local_48);
        glVertex3dv(&local_60);
        glVertex3dv(&local_48);
        glVertex3dv(&local_100);
        glVertex3dv(&local_60);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 9);
      uVar7 = uVar8;
    } while (uVar8 != 3);
    glEnd();
    if ((local_d0->transformedMode == false) || (local_d0->objectMode == true)) {
      drawCenterHandle(local_d0);
    }
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawTranslateHandles() const
{
   const double arrowSize = .15;
   const int nSides = 8;

   if (target.object == nullptr) return;
   
   int startAxis = (transformedMode && !objectMode) ? 2 : 0;

   Vector3D c = center;
   double r = (bounds.max - bounds.min).norm() / 2.;

   // Draw arrow stems
   glLineWidth( 8. );
   glBegin( GL_LINES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D b = c + (1.-arrowSize)*r*axes[i];

      glColor4ubv( &axisColors[i][0] );

      glVertex3dv( &c.x );
      glVertex3dv( &b.x );
   }
   glEnd();

   // Draw arrow heads
   glBegin( GL_TRIANGLES );
   for( int i = startAxis; i < 3; i++ )
   {
      Vector3D a = c + r*axes[i];
      Vector3D b = c + (1.-arrowSize)*r*axes[i];
      Vector3D e0 = r*.5*arrowSize*axes[(i+1)%3];
      Vector3D e1 = r*.5*arrowSize*axes[(i+2)%3];

      glColor4ubv( &axisColors[i][0] );

      for( int j = 0; j < nSides; j++ )
      {
         double theta1 = 2.*M_PI * (double) j / (double) nSides;
         double theta2 = 2.*M_PI * (double) (j+1) / (double) nSides;
         Vector3D p0 = b + cos(theta1)*e0 - sin(theta1)*e1;
         Vector3D p1 = b + cos(theta2)*e0 - sin(theta2)*e1;

         glVertex3dv( &a.x );
         glVertex3dv( &p0.x );
         glVertex3dv( &p1.x );

         glVertex3dv( &p0.x );
         glVertex3dv( &b.x );
         glVertex3dv( &p1.x );
      }

   }
   glEnd();

   if (!transformedMode || objectMode) drawCenterHandle();
   glLineWidth( 1. );
}